

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveFile::Encode(CDirectiveFile *this)

{
  if (this->type < Close) {
    FileManager::openFile(g_fileManager,&this->file->super_AssemblerFile,false);
    return;
  }
  if (this->type == Close) {
    FileManager::closeFile(g_fileManager);
    return;
  }
  return;
}

Assistant:

void CDirectiveFile::Encode()
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,false);
		break;
	case Type::Close:
		g_fileManager->closeFile();
		break;
	}
}